

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

void __thiscall
Lib::UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_>::~UniquePersistentIterator
          (UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *this)

{
  ~UniquePersistentIterator(this);
  ::operator_delete(this,0x20);
  return;
}

Assistant:

~UniquePersistentIterator()
  {
    if(_items) {
      ItemList::destroy(_items);
    }
  }